

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O3

wchar_t parse_digest(archive_read *a,archive_entry *entry,char *digest,wchar_t type)

{
  char cVar1;
  ulong uVar2;
  wchar_t wVar3;
  size_t sVar4;
  long lVar5;
  int iVar6;
  char *fmt;
  int iVar7;
  uchar digest_buf [64];
  byte local_68 [64];
  
  uVar2 = *(ulong *)(bid_entry_safe_char + (long)type * 8 + 0xf8);
  sVar4 = strnlen(digest,uVar2 | 1);
  if (sVar4 == uVar2) {
    lVar5 = 0;
    do {
      cVar1 = digest[lVar5 * 2];
      if ((byte)(cVar1 - 0x30U) < 10) {
        iVar6 = cVar1 + -0x30;
      }
      else {
        iVar6 = cVar1 + -0x57;
        if (5 < (byte)(cVar1 + 0x9fU)) {
          iVar6 = -1;
        }
      }
      cVar1 = digest[lVar5 * 2 + 1];
      if ((byte)(cVar1 - 0x30U) < 10) {
        iVar7 = cVar1 + -0x30;
      }
      else {
        iVar7 = cVar1 + -0x57;
        if (5 < (byte)(cVar1 + 0x9fU)) {
          iVar7 = -1;
        }
      }
      if ((iVar6 == -1) || (iVar7 == -1)) {
        fmt = "invalid digest data, ignoring";
        goto LAB_0013f6a4;
      }
      local_68[lVar5] = (byte)iVar7 | (byte)(iVar6 << 4);
      lVar5 = lVar5 + 1;
    } while ((uVar2 - 1 >> 1) + 1 != lVar5);
    wVar3 = archive_entry_set_digest(entry,type,local_68);
  }
  else {
    fmt = "incorrect digest length, ignoring";
LAB_0013f6a4:
    archive_set_error(&a->archive,0x54,fmt);
    wVar3 = L'\xffffffec';
  }
  return wVar3;
}

Assistant:

static int
parse_digest(struct archive_read *a, struct archive_entry *entry,
    const char *digest, int type)
{
	unsigned char digest_buf[64];
	int high, low;
	size_t i, j, len;

	switch (type) {
	case ARCHIVE_ENTRY_DIGEST_MD5:
		len = sizeof(entry->digest.md5);
		break;
	case ARCHIVE_ENTRY_DIGEST_RMD160:
		len = sizeof(entry->digest.rmd160);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA1:
		len = sizeof(entry->digest.sha1);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA256:
		len = sizeof(entry->digest.sha256);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA384:
		len = sizeof(entry->digest.sha384);
		break;
	case ARCHIVE_ENTRY_DIGEST_SHA512:
		len = sizeof(entry->digest.sha512);
		break;
	default:
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			"Internal error: Unknown digest type");
		return ARCHIVE_FATAL;
	}

	if (len > sizeof(digest_buf)) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
			"Internal error: Digest storage too large");
		return ARCHIVE_FATAL;
	}

	len *= 2;

	if (mtree_strnlen(digest, len+1) != len) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
				  "incorrect digest length, ignoring");
		return ARCHIVE_WARN;
	}

	for (i = 0, j = 0; i < len; i += 2, j++) {
		high = parse_hex_nibble(digest[i]);
		low = parse_hex_nibble(digest[i+1]);
		if (high == -1 || low == -1) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
					  "invalid digest data, ignoring");
			return ARCHIVE_WARN;
		}

		digest_buf[j] = high << 4 | low;
	}

	return archive_entry_set_digest(entry, type, digest_buf);
}